

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall LinkedReadsDatastore::print_status(LinkedReadsDatastore *this)

{
  bool bVar1;
  LogLevels *pLVar2;
  ostream *poVar3;
  size_t sVar4;
  string *in_RDI;
  uint t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  LinkedTag prevtag;
  uint64_t tagcount;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  string *local_20;
  undefined1 in_stack_ffffffffffffffeb;
  LogLevels level;
  LinkedReadsMapper *this_00;
  
  this_00 = (LinkedReadsMapper *)0x0;
  level = INFO;
  local_20 = in_RDI + 0x110;
  local_28._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffffb8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    pLVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_28);
    if (*pLVar2 != level) {
      this_00 = (LinkedReadsMapper *)((long)&this_00->ws + 1);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_28);
  }
  poVar3 = sdglib::OutputLog(level,(bool)in_stack_ffffffffffffffeb);
  poVar3 = std::operator<<(poVar3,"LinkedRead Datastore from ");
  poVar3 = std::operator<<(poVar3,in_RDI);
  poVar3 = std::operator<<(poVar3," contains ");
  sVar4 = size((LinkedReadsDatastore *)0x3be3d5);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4 - 1);
  poVar3 = std::operator<<(poVar3," reads, with a maximum size of ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(in_RDI + 0x20));
  poVar3 = std::operator<<(poVar3," in ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)this_00);
  poVar3 = std::operator<<(poVar3," tags.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  LinkedReadsMapper::print_status(this_00);
  return;
}

Assistant:

void LinkedReadsDatastore::print_status() const {
    uint64_t tagcount=0;
    LinkedTag prevtag=0;
    for (auto t:read_tag) {
        if (t != prevtag) {
            ++tagcount;
            t = prevtag;
        }
    }
    sdglib::OutputLog()<<"LinkedRead Datastore from "<<filename<<" contains "<<size()-1<<" reads, with a maximum size of " << readsize << " in "<< tagcount <<" tags."<<std::endl;
    mapper.print_status();
}